

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O2

FT_Fixed FT_Tan(FT_Angle angle)

{
  FT_Long FVar1;
  FT_Vector v;
  FT_Vector local_18;
  
  local_18.x = 0x1000000;
  local_18.y = 0;
  ft_trig_pseudo_rotate(&local_18,angle);
  FVar1 = FT_DivFix(local_18.y,local_18.x);
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Fixed )
  FT_Tan( FT_Angle  angle )
  {
    FT_Vector  v = { 1 << 24, 0 };


    ft_trig_pseudo_rotate( &v, angle );

    return FT_DivFix( v.y, v.x );
  }